

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBlock.cpp
# Opt level: O0

void __thiscall Memory::LargeHeapBlock::Verify(LargeHeapBlock *this,Recycler *recycler)

{
  LargeObjectHeader *this_00;
  byte bVar1;
  LargeObjectHeader **ppLVar2;
  void *pvVar3;
  BYTE *objectAddress;
  LargeHeapBlockFreeListEntry *current;
  LargeObjectHeader *header;
  uint i;
  uint verifyFinalizeCount;
  char *lastAddress;
  Recycler *recycler_local;
  LargeHeapBlock *this_local;
  
  _i = (LargeObjectHeader *)(this->super_HeapBlock).address;
  header._4_4_ = 0;
  header._0_4_ = 0;
  do {
    if (this->allocCount <= (uint)header) {
      Recycler::VerifyCheck
                ((uint)(header._4_4_ == this->finalizeCount),
                 L"LargeHeapBlock finalize object count mismatch",(this->super_HeapBlock).address,
                 &this->finalizeCount);
      return;
    }
    ppLVar2 = HeaderList(this);
    this_00 = ppLVar2[(uint)header];
    if (this_00 == (LargeObjectHeader *)0x0) {
      for (objectAddress = (BYTE *)(this->freeList).entries; objectAddress != (BYTE *)0x0;
          objectAddress = *(BYTE **)(objectAddress + 0x18)) {
        if (*(uint *)objectAddress == (uint)header) {
          Recycler::VerifyCheck
                    ((uint)(*(LargeHeapBlock **)(objectAddress + 0x10) == this),
                     L"Invalid heap block",this,*(void **)(objectAddress + 0x10));
          Recycler::VerifyCheck
                    ((uint)(_i <= objectAddress),L"LargeHeapBlock invalid object header order",
                     (this->super_HeapBlock).address,objectAddress);
          Recycler::VerifyCheckFill(_i,(long)objectAddress - (long)_i);
          Recycler::VerifyCheckPad(recycler,objectAddress + 0x20,*(size_t *)(objectAddress + 8));
          _i = (LargeObjectHeader *)(objectAddress + 0x20 + *(long *)(objectAddress + 8));
          break;
        }
      }
    }
    else {
      Recycler::VerifyCheck
                ((uint)(_i <= this_00),L"LargeHeapBlock invalid object header order",
                 (this->super_HeapBlock).address,this_00);
      Recycler::VerifyCheckFill(_i,(long)this_00 - (long)_i);
      Recycler::VerifyCheck
                ((uint)(this_00->objectIndex == (uint)header),
                 L"LargeHeapBlock object index mismatch",(this->super_HeapBlock).address,this_00);
      pvVar3 = LargeObjectHeader::GetAddress(this_00);
      Recycler::VerifyCheckPad(recycler,pvVar3,this_00->objectSize);
      bVar1 = LargeObjectHeader::GetAttributes(this_00,this->heapInfo->recycler->Cookie);
      header._4_4_ = ((bVar1 & 0x80) != 0) + header._4_4_;
      pvVar3 = LargeObjectHeader::GetAddress(this_00);
      _i = (LargeObjectHeader *)((long)pvVar3 + this_00->objectSize);
    }
    header._0_4_ = (uint)header + 1;
  } while( true );
}

Assistant:

void
LargeHeapBlock::Verify(Recycler * recycler)
{
    char * lastAddress = this->address;
    uint verifyFinalizeCount = 0;
    for (uint i = 0; i < allocCount; i++)
    {
        LargeObjectHeader * header = this->HeaderList()[i];
        if (header == nullptr)
        {
            // Check if the object if on the free list
            LargeHeapBlockFreeListEntry* current = this->freeList.entries;

            while (current != nullptr)
            {
                // Verify the free listed object
                if (current->headerIndex == i)
                {
                    BYTE* objectAddress = (BYTE *)current + sizeof(LargeObjectHeader);
                    Recycler::VerifyCheck(current->heapBlock == this, _u("Invalid heap block"), this, current->heapBlock);
                    Recycler::VerifyCheck((char *)current >= lastAddress, _u("LargeHeapBlock invalid object header order"), this->address, current);
                    Recycler::VerifyCheckFill(lastAddress, (char *)current - lastAddress);
                    recycler->VerifyCheckPad(objectAddress, current->objectSize);
                    lastAddress = (char *) objectAddress + current->objectSize;
                    break;
                }

                current = current->next;
            }

            continue;
        }

        Recycler::VerifyCheck((char *)header >= lastAddress, _u("LargeHeapBlock invalid object header order"), this->address, header);
        Recycler::VerifyCheckFill(lastAddress, (char *)header - lastAddress);
        Recycler::VerifyCheck(header->objectIndex == i, _u("LargeHeapBlock object index mismatch"), this->address, &header->objectIndex);
        recycler->VerifyCheckPad((BYTE *)header->GetAddress(), header->objectSize);

        verifyFinalizeCount += ((header->GetAttributes(this->heapInfo->recycler->Cookie) & FinalizeBit) != 0);
        lastAddress = (char *)header->GetAddress() + header->objectSize;
    }

    Recycler::VerifyCheck(verifyFinalizeCount == this->finalizeCount, _u("LargeHeapBlock finalize object count mismatch"), this->address, &this->finalizeCount);
}